

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

uchar * __thiscall kj::Vector<unsigned_char>::add<int>(Vector<unsigned_char> *this,int *params)

{
  bool bVar1;
  int *params_00;
  uchar *puVar2;
  int *params_local;
  Vector<unsigned_char> *this_local;
  
  bVar1 = ArrayBuilder<unsigned_char>::isFull(&this->builder);
  if (bVar1) {
    grow(this,0);
  }
  params_00 = fwd<int>(params);
  puVar2 = ArrayBuilder<unsigned_char>::add<int>(&this->builder,params_00);
  return puVar2;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }